

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O2

int cram_add_quality(cram_fd *fd,cram_container *c,cram_slice *s,cram_record *r,int pos,char qual)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  size_t __size;
  undefined1 auVar7 [16];
  double dVar8;
  cram_feature f;
  anon_union_16_11_96f556d8_for_cram_feature_0 local_38;
  
  local_38.X.pos = (int)r + 1;
  local_38.X.code = 0x51;
  local_38.X.base = pos;
  cram_stats_add((cram_stats *)fd->m[0x14],pos);
  lVar5 = *(long *)&c->last_pos;
  while( true ) {
    uVar1 = *(ulong *)(lVar5 + 0x28);
    lVar2 = *(long *)(lVar5 + 0x30);
    uVar6 = lVar2 + 1;
    if (uVar6 < uVar1) break;
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    dVar8 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
    uVar6 = (ulong)dVar8;
    __size = (long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
    if (uVar1 == 0) {
      __size = 0x400;
    }
    *(size_t *)(lVar5 + 0x28) = __size;
    pvVar4 = realloc(*(void **)(lVar5 + 0x20),__size);
    lVar5 = *(long *)&c->last_pos;
    *(void **)(lVar5 + 0x20) = pvVar4;
  }
  *(ulong *)(lVar5 + 0x30) = uVar6;
  *(char *)(*(long *)(lVar5 + 0x20) + lVar2) = (char)pos;
  iVar3 = cram_add_feature((cram_container *)fd,(cram_slice *)c,(cram_record *)s,
                           (cram_feature *)&local_38.X);
  return iVar3;
}

Assistant:

static int cram_add_quality(cram_fd *fd, cram_container *c,
			    cram_slice *s, cram_record *r,
			    int pos, char qual) {
    cram_feature f;
    f.Q.pos = pos+1;
    f.Q.code = 'Q';
    f.Q.qual = qual;
    cram_stats_add(c->stats[DS_QS], qual);
    BLOCK_APPEND_CHAR(s->qual_blk, qual);
    return cram_add_feature(c, s, r, &f);
}